

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binarymodelserialiser.cpp
# Opt level: O0

bool __thiscall BinaryModelSerialiser::saveModel(BinaryModelSerialiser *this,QIODevice *destination)

{
  QIODevice *pQVar1;
  ulong uVar2;
  BinaryModelSerialiserPrivate *this_00;
  QDataStream local_50 [8];
  QDataStream witer;
  BinaryModelSerialiserPrivate *d;
  QIODevice *local_20;
  QIODevice *destination_local;
  BinaryModelSerialiser *this_local;
  
  if (destination == (QIODevice *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    local_20 = destination;
    destination_local = (QIODevice *)this;
    uVar2 = QIODevice::isOpen();
    pQVar1 = local_20;
    if ((uVar2 & 1) == 0) {
      QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                ((QFlags<QIODeviceBase::OpenModeFlag> *)((long)&d + 4),WriteOnly);
      uVar2 = (**(code **)(*(long *)pQVar1 + 0x68))(pQVar1,d._4_4_);
      if ((uVar2 & 1) == 0) {
        this_local._7_1_ = 0;
        goto LAB_00132559;
      }
    }
    uVar2 = QIODevice::isWritable();
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = 0;
    }
    else {
      this_00 = d_func(this);
      if ((this_00->super_AbstractModelSerialiserPrivate).m_constModel == (QAbstractItemModel *)0x0)
      {
        this_local._7_1_ = 0;
      }
      else {
        QDataStream::QDataStream(local_50,local_20);
        QDataStream::setVersion
                  (local_50,(this_00->super_AbstractModelSerialiserPrivate).m_streamVersion);
        this_local._7_1_ = BinaryModelSerialiserPrivate::writeBinary(this_00,local_50);
        QDataStream::~QDataStream(local_50);
      }
    }
  }
LAB_00132559:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool BinaryModelSerialiser::saveModel(QIODevice *destination) const
{
    if (!destination)
        return false;
    if (!destination->isOpen()) {
        if (!destination->open(QIODevice::WriteOnly))
            return false;
    }
    if (!destination->isWritable())
        return false;
    Q_D(const BinaryModelSerialiser);

    if (!d->m_constModel)
        return false;
    QDataStream witer(destination);
    witer.setVersion(d->m_streamVersion);
    return d->writeBinary(witer);
}